

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O0

int16_t OpalOperator_Output(OpalOperator *self,uint16_t keyscalenum,uint32_t phase_step,
                           int16_t vibrato,int16_t mod,int16_t fbshift)

{
  short sVar1;
  uint16_t uVar2;
  ushort uVar3;
  bool bVar4;
  short local_32;
  uint16_t local_30;
  uint16_t negate;
  uint16_t level;
  uint16_t add;
  uint16_t logsin;
  uint16_t offset;
  uint16_t phase;
  uint16_t mix;
  int16_t v;
  int16_t fbshift_local;
  int16_t mod_local;
  int16_t vibrato_local;
  uint32_t phase_step_local;
  uint16_t keyscalenum_local;
  OpalOperator *self_local;
  
  _v = phase_step;
  if (self->VibratoEnable != 0) {
    _v = (int)vibrato + phase_step;
  }
  self->Phase = (_v * self->FreqMultTimes2 >> 1) + self->Phase;
  sVar1 = self->EnvelopeLevel;
  if (self->TremoloEnable == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = self->Master->TremoloLevel;
  }
  switch(self->EnvelopeStage) {
  case 0:
    local_32 = (short)((int)(((int)(uint)self->AttackAdd >>
                             ((byte)self->AttackTab
                                    [(int)((int)(uint)self->Master->Clock >>
                                           ((byte)self->AttackShift & 0x1f) & 7)] & 0x1f)) *
                            ((int)self->EnvelopeLevel ^ 0xffffffffU)) >> 3);
    if (self->AttackRate == 0) {
      local_32 = 0;
    }
    if ((self->AttackMask != 0) && ((self->Master->Clock & self->AttackMask) != 0)) {
      local_32 = 0;
    }
    self->EnvelopeLevel = self->EnvelopeLevel + local_32;
    if (self->EnvelopeLevel < 1) {
      self->EnvelopeLevel = 0;
      self->EnvelopeStage = 1;
    }
    break;
  case 1:
    local_32 = (short)((int)(uint)self->DecayAdd >>
                      ((byte)self->DecayTab
                             [(int)((int)(uint)self->Master->Clock >>
                                    ((byte)self->DecayShift & 0x1f) & 7)] & 0x1f));
    if (self->DecayRate == 0) {
      local_32 = 0;
    }
    if ((self->DecayMask != 0) && ((self->Master->Clock & self->DecayMask) != 0)) {
      local_32 = 0;
    }
    self->EnvelopeLevel = self->EnvelopeLevel + local_32;
    if ((int)(uint)self->SustainLevel <= (int)self->EnvelopeLevel) {
      self->EnvelopeLevel = self->SustainLevel;
      self->EnvelopeStage = 2;
    }
    break;
  case 2:
    if (self->SustainMode != 0) break;
  case 3:
    local_32 = (short)((int)(uint)self->ReleaseAdd >>
                      ((byte)self->ReleaseTab
                             [(int)((int)(uint)self->Master->Clock >>
                                    ((byte)self->ReleaseShift & 0x1f) & 7)] & 0x1f));
    if (self->ReleaseRate == 0) {
      local_32 = 0;
    }
    if ((self->ReleaseMask != 0) && ((self->Master->Clock & self->ReleaseMask) != 0)) {
      local_32 = 0;
    }
    self->EnvelopeLevel = self->EnvelopeLevel + local_32;
    if (0x1fe < self->EnvelopeLevel) {
      self->EnvelopeLevel = 0x1ff;
      self->EnvelopeStage = -1;
      self->Out[1] = 0;
      self->Out[0] = 0;
      return 0;
    }
    break;
  default:
    self->Out[1] = 0;
    self->Out[0] = 0;
    return 0;
  }
  phase = mod;
  if (fbshift != 0) {
    phase = mod + (short)((int)self->Out[0] + (int)self->Out[1] >> ((byte)fbshift & 0x1f));
  }
  uVar3 = (short)(self->Phase >> 10) + phase;
  negate = uVar3 & 0xff;
  bVar4 = false;
  switch(self->Waveform) {
  case 0:
    if ((uVar3 & 0x100) != 0) {
      negate = negate ^ 0xff;
    }
    local_30 = LogSinTable[negate];
    bVar4 = (uVar3 & 0x200) != 0;
    break;
  case 1:
    if ((uVar3 & 0x200) == 0) {
      if ((uVar3 & 0x100) != 0) {
        negate = negate ^ 0xff;
      }
    }
    else {
      negate = 0;
    }
    local_30 = LogSinTable[negate];
    break;
  case 2:
    if ((uVar3 & 0x100) != 0) {
      negate = negate ^ 0xff;
    }
    local_30 = LogSinTable[negate];
    break;
  case 3:
    if ((uVar3 & 0x100) != 0) {
      negate = 0;
    }
    local_30 = LogSinTable[negate];
    break;
  case 4:
    if ((uVar3 & 0x200) == 0) {
      if ((uVar3 & 0x80) != 0) {
        negate = negate ^ 0xff;
      }
      negate = negate * 2 & 0xff;
      bVar4 = (uVar3 & 0x100) != 0;
    }
    else {
      negate = 0;
    }
    local_30 = LogSinTable[negate];
    break;
  case 5:
    if ((uVar3 & 0x200) == 0) {
      negate = negate * 2 & 0xff;
      if ((uVar3 & 0x80) != 0) {
        negate = negate ^ 0xff;
      }
    }
    else {
      negate = 0;
    }
    local_30 = LogSinTable[negate];
    break;
  case 6:
    local_30 = 0;
    bVar4 = (uVar3 & 0x200) != 0;
    break;
  default:
    local_30 = uVar3 & 0x1ff;
    bVar4 = (uVar3 & 0x200) != 0;
    if (bVar4) {
      local_30 = local_30 ^ 0x1ff;
    }
    local_30 = local_30 << 3;
  }
  add = local_30 + (sVar1 + self->OutputLevel + self->KeyScaleLevel + uVar2) * 8;
  if (0x1fff < add) {
    add = 0x1fff;
  }
  logsin = (short)((int)(short)(ExpTable[(int)(add & 0xff)] + 0x400) >> ((byte)(add >> 8) & 0x1f)) *
           2;
  if (bVar4) {
    logsin = logsin ^ 0xffff;
  }
  self->Out[1] = self->Out[0];
  self->Out[0] = logsin;
  return logsin;
}

Assistant:

static int16_t OpalOperator_Output(OpalOperator *self, uint16_t keyscalenum, uint32_t phase_step, int16_t vibrato, int16_t mod, int16_t fbshift)
{
    int16_t v;
    uint16_t mix, phase, offset, logsin, add, level, negate;

    (void)keyscalenum;

    /* Advance wave phase */
    if(self->VibratoEnable)
        phase_step += vibrato;

    self->Phase += (phase_step * self->FreqMultTimes2) / 2;

    level = (self->EnvelopeLevel + self->OutputLevel + self->KeyScaleLevel + (self->TremoloEnable ? self->Master->TremoloLevel : 0)) << 3;

    switch(self->EnvelopeStage)
    {

    /* Attack stage */
    case OpalEnvAtt:
    {
        add = ((self->AttackAdd >> self->AttackTab[self->Master->Clock >> self->AttackShift & 7]) * ~self->EnvelopeLevel) >> 3;

        if(self->AttackRate == 0)
            add = 0;

        if(self->AttackMask && (self->Master->Clock & self->AttackMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel <= 0)
        {
            self->EnvelopeLevel = 0;
            self->EnvelopeStage = OpalEnvDec;
        }

        break;
    }

    /* Decay stage */
    case OpalEnvDec:
    {
        add = self->DecayAdd >> self->DecayTab[self->Master->Clock >> self->DecayShift & 7];

        if(self->DecayRate == 0)
            add = 0;

        if(self->DecayMask && (self->Master->Clock & self->DecayMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel >= self->SustainLevel)
        {
            self->EnvelopeLevel = self->SustainLevel;
            self->EnvelopeStage = OpalEnvSus;
        }

        break;
    }

    /* Sustain stage */
    case OpalEnvSus:
    {
        if(self->SustainMode)
            break;

        /* Note: fall-through! */

    } /* fallthrough */

    /* Release stage */
    case OpalEnvRel:
    {
        add = self->ReleaseAdd >> self->ReleaseTab[self->Master->Clock >> self->ReleaseShift & 7];

        if(self->ReleaseRate == 0)
            add = 0;

        if(self->ReleaseMask && (self->Master->Clock & self->ReleaseMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel >= 0x1FF)
        {
            self->EnvelopeLevel = 0x1FF;
            self->EnvelopeStage = OpalEnvOff;
            self->Out[0] = self->Out[1] = 0;
            return 0;
        }

        break;
    }

    /* Envelope, and therefore the operator, is not running */
    default:
        self->Out[0] = self->Out[1] = 0;
        return 0;
    }

    /* Feedback?  In that case we modulate by a blend of the last two samples */
    if(fbshift)
        mod += (self->Out[0] + self->Out[1]) >> fbshift;

    phase = (self->Phase >> 10) + mod;
    offset = phase & 0xFF;
    negate = OPAL_FALSE;

    switch(self->Waveform)
    {

    /*------------------------------------
     * Standard sine wave
     *------------------------------------*/
    case 0:
        if(phase & 0x100)
            offset ^= 0xFF;

        logsin = LogSinTable[offset];
        negate = (phase & 0x200) != 0;
        break;

    /*------------------------------------
     * Half sine wave
     *------------------------------------*/
    case 1:
        if(phase & 0x200)
            offset = 0;
        else if(phase & 0x100)
            offset ^= 0xFF;

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Positive sine wave
     *------------------------------------*/
    case 2:
        if(phase & 0x100)
            offset ^= 0xFF;

        logsin =  LogSinTable[offset];
        break;

    /*------------------------------------
     * Quarter positive sine wave
     *------------------------------------*/
    case 3:
        if(phase & 0x100)
            offset = 0;

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Double-speed sine wave
     *------------------------------------*/
    case 4:
        if(phase & 0x200)
            offset = 0;

        else
        {

            if(phase & 0x80)
                offset ^= 0xFF;

            offset = (offset + offset) & 0xFF;
            negate = (phase & 0x100) != 0;
        }

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Double-speed positive sine wave
     *------------------------------------*/
    case 5:
        if(phase & 0x200)
            offset = 0;

        else
        {

            offset = (offset + offset) & 0xFF;

            if(phase & 0x80)
                offset ^= 0xFF;
        }

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Square wave
     *------------------------------------*/
    case 6:
        logsin = 0;
        negate = (phase & 0x200) != 0;
        break;

    /*------------------------------------
     * Exponentiation wave
     *------------------------------------*/
    default:
        logsin = phase & 0x1FF;

        if(phase & 0x200)
        {
            logsin ^= 0x1FF;
            negate = OPAL_TRUE;
        }

        logsin <<= 3;
        break;
    }

    mix = logsin + level;

    if(mix > 0x1FFF)
        mix = 0x1FFF;

    /* From the OPLx decapsulated docs:
     * "When such a table is used for calculation of the exponential, the table is read at the
     * position given by the 8 LSB's of the input. The value + 1024 (the hidden bit) is then the
     * significand of the floating point output and the yet unused MSB's of the input are the
     * exponent of the floating point output." */
    v = ExpTable[mix & 0xFF] + 1024;
    v >>= mix >> 8;
    v += v;

    if(negate)
        v = ~v;

    /* Keep last two results for feedback calculation */
    self->Out[1] = self->Out[0];
    self->Out[0] = v;

    return v;
}